

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void del_tokens(VARR_token_t *tokens,int from,int len)

{
  size_t sVar1;
  token_t *pptVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  sVar1 = VARR_token_tlength(tokens);
  pptVar2 = VARR_token_taddr(tokens);
  iVar5 = (int)sVar1;
  iVar4 = iVar5 - from;
  if (-1 < len) {
    iVar4 = len;
  }
  uVar3 = iVar5 - (iVar4 + from);
  if (iVar4 + from <= iVar5) {
    if (0 < (int)uVar3) {
      memmove(pptVar2 + from,pptVar2 + from + iVar4,(ulong)uVar3 << 3);
    }
    VARR_token_ttrunc(tokens,(long)(iVar5 - iVar4));
    return;
  }
  __assert_fail("from + len <= tokens_len",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0xa9b,"void del_tokens(VARR_token_t *, int, int)");
}

Assistant:

static void del_tokens (VARR (token_t) * tokens, int from, int len) {
  int diff, tokens_len = (int) VARR_LENGTH (token_t, tokens);
  token_t *addr = VARR_ADDR (token_t, tokens);

  if (len < 0) len = tokens_len - from;
  assert (from + len <= tokens_len);
  if ((diff = tokens_len - from - len) > 0)
    memmove (addr + from, addr + from + len, diff * sizeof (token_t));
  VARR_TRUNC (token_t, tokens, tokens_len - len);
}